

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImBezierCubicClosestPoint
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  ImVec2 IVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float extraout_XMM0_Dc;
  float fVar7;
  float extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  if (num_segments < 1) {
    fVar10 = 0.0;
    fVar12 = 0.0;
  }
  else {
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar10 = 0.0;
    fVar12 = 0.0;
    fVar9 = (*p1).x;
    fVar11 = (*p1).y;
    fVar8 = 3.4028235e+38;
    iVar2 = 1;
    do {
      IVar1 = ImBezierCubicCalc(p1,p2,p3,p4,(float)iVar2 * (1.0 / (float)num_segments));
      fVar4 = IVar1.x;
      fVar5 = IVar1.y;
      fVar13 = fVar4 - fVar9;
      fVar16 = fVar5 - fVar11;
      fVar17 = (p->x - fVar9) * fVar13 + (p->y - fVar11) * fVar16;
      fVar19 = fVar9;
      fVar20 = fVar11;
      if ((0.0 <= fVar17) &&
         (fVar18 = fVar13 * fVar13 + fVar16 * fVar16, fVar19 = fVar4, fVar20 = fVar5,
         fVar17 <= fVar18)) {
        auVar14._0_4_ = fVar13 * fVar17;
        auVar14._4_4_ = fVar16 * fVar17;
        auVar14._8_4_ = (extraout_XMM0_Dc - fVar6) * fVar17;
        auVar14._12_4_ = (extraout_XMM0_Dd - fVar7) * fVar17;
        auVar15._4_4_ = fVar18;
        auVar15._0_4_ = fVar18;
        auVar15._8_4_ = fVar18;
        auVar15._12_4_ = fVar18;
        auVar15 = divps(auVar14,auVar15);
        fVar19 = fVar9 + auVar15._0_4_;
        fVar20 = fVar11 + auVar15._4_4_;
      }
      fVar9 = p->x - fVar19;
      fVar11 = p->y - fVar20;
      fVar13 = fVar9 * fVar9 + fVar11 * fVar11;
      if (fVar8 <= fVar13) {
        fVar13 = fVar8;
        fVar20 = fVar12;
        fVar19 = fVar10;
      }
      fVar10 = fVar19;
      fVar12 = fVar20;
      bVar3 = iVar2 != num_segments;
      fVar9 = fVar4;
      fVar11 = fVar5;
      fVar6 = extraout_XMM0_Dc;
      fVar7 = extraout_XMM0_Dd;
      fVar8 = fVar13;
      iVar2 = iVar2 + 1;
    } while (bVar3);
  }
  IVar1.y = fVar12;
  IVar1.x = fVar10;
  return IVar1;
}

Assistant:

ImVec2 ImBezierCubicClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierCubicClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}